

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void init_films(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  unique_ptr<spatial_region,_std::default_delete<spatial_region>_> this;
  bool bVar3;
  film **ppfVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 in_XMM8_Qb;
  
  ppfVar4 = &p_last_film;
  while (ppfVar4 = &((film *)ppfVar4)->prev->prev, (film *)ppfVar4 != (film *)0x0) {
    if (((((film *)ppfVar4)->xnpic_film == 0) || (((film *)ppfVar4)->ynpic_film == 0)) ||
       (((film *)ppfVar4)->znpic_film == 0)) {
      ((film *)ppfVar4)->xnpic_film = xnpic;
      ((film *)ppfVar4)->ynpic_film = ynpic;
      ((film *)ppfVar4)->znpic_film = znpic;
    }
    dVar6 = ((film *)ppfVar4)->ne;
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      ((film *)ppfVar4)->ne_y0 = dVar6;
      ((film *)ppfVar4)->ne_y1 = dVar6;
      dVar5 = dVar6;
    }
    else {
      dVar6 = ((film *)ppfVar4)->ne_y0;
      dVar5 = ((film *)ppfVar4)->ne_y1;
    }
    this._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
    super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
    super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
         psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
         super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
         super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = ((film *)ppfVar4)->x0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dx;
    auVar12._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[mpi_rank];
    auVar12._8_8_ = in_XMM8_Qb;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = ((film *)ppfVar4)->x0 + ((film *)ppfVar4)->filmwidth;
    auVar13 = vfnmadd231sd_fma(auVar13,auVar10,auVar12);
    auVar8 = vfnmadd213sd_fma(auVar12,auVar10,auVar8);
    dVar7 = (11148500000000.0 / lambda) / lambda;
    bVar3 = std::operator==(&ions_abi_cxx11_,"on");
    auVar9._8_8_ = 0;
    auVar9._0_8_ = nerflow;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = nelflow;
    uVar1 = vcmppd_avx512vl(auVar9,ZEXT816(0) << 0x40,4);
    uVar2 = vcmppd_avx512vl(auVar11,ZEXT816(0) << 0x40,4);
    spatial_region::film
              ((spatial_region *)
               this._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
               ._M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,auVar8._0_8_,
               auVar13._0_8_,dVar6 / dVar7,dVar5 / dVar7,(uint)bVar3,
               1.0 / (((film *)ppfVar4)->mcr * 1836.1526721),((film *)ppfVar4)->gradwidth,
               ((film *)ppfVar4)->y0,((film *)ppfVar4)->y1,((film *)ppfVar4)->z0,
               ((film *)ppfVar4)->z1,((film *)ppfVar4)->T,((film *)ppfVar4)->vx,
               (bool)(((byte)uVar2 & 3 | (byte)uVar1 & 3) & 1),((film *)ppfVar4)->xnpic_film,
               ((film *)ppfVar4)->ynpic_film,((film *)ppfVar4)->znpic_film,false,
               ((film *)ppfVar4)->gradwidth_y);
  }
  return;
}

Assistant:

void init_films()
{
    film* tmp_p_film = p_last_film;
    while (tmp_p_film!=0)
    {
        /* x0film - координата левой границы плёнки, filmwidth - её
         * толщина, gradwidth - толщина части плёнки с линейным ростом
         * плотности */
        if (tmp_p_film->xnpic_film == 0 || tmp_p_film->ynpic_film == 0 || tmp_p_film->znpic_film == 0)
        {
            tmp_p_film->xnpic_film = xnpic;
            tmp_p_film->ynpic_film = ynpic;
            tmp_p_film->znpic_film = znpic;
        }
        if (tmp_p_film->ne != 0)
        {
            tmp_p_film->ne_y0 = tmp_p_film->ne;
            tmp_p_film->ne_y1 = tmp_p_film->ne;
        }

        psr->film(
            tmp_p_film->x0-dx*x0_sr[mpi_rank], 
            tmp_p_film->x0+tmp_p_film->filmwidth-dx*x0_sr[mpi_rank],
            tmp_p_film->ne_y0/(1.11485e+13/lambda/lambda),
            tmp_p_film->ne_y1/(1.11485e+13/lambda/lambda),
            ions == "on",
            1/(proton_mass*tmp_p_film->mcr),
            tmp_p_film->gradwidth,
            tmp_p_film->y0,
            tmp_p_film->y1,
            tmp_p_film->z0,
            tmp_p_film->z1,
            tmp_p_film->T,
            tmp_p_film->vx,
            nelflow != 0 || nerflow != 0,
            tmp_p_film->xnpic_film,
            tmp_p_film->ynpic_film,
            tmp_p_film->znpic_film,
            false,
            tmp_p_film->gradwidth_y
        );
        tmp_p_film = tmp_p_film->prev;
    }
}